

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBiDirectionalLSTMLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  uint64_t uVar1;
  NeuralNetworkLayer *pNVar2;
  bool bVar3;
  int iVar4;
  BiDirectionalLSTMLayerParams *pBVar5;
  RepeatedPtrField<CoreML::Specification::ActivationParams> *pRVar6;
  reference pAVar7;
  UniDirectionalLSTMLayerParams *pUVar8;
  LSTMWeightParams *lstmWeightParams;
  LSTMParams *pLVar9;
  string *psVar10;
  WeightParams *pWVar11;
  uint64_t uVar12;
  allocator<char> local_bb9;
  string local_bb8;
  allocator<char> local_b91;
  string local_b90;
  byte local_b6a;
  allocator<char> local_b69;
  string local_b68;
  allocator<char> local_b41;
  string local_b40;
  byte local_b1a;
  allocator<char> local_b19;
  string local_b18;
  allocator<char> local_af1;
  string local_af0;
  byte local_aca;
  allocator<char> local_ac9;
  string local_ac8;
  allocator<char> local_aa1;
  string local_aa0;
  byte local_a7a;
  allocator<char> local_a79;
  string local_a78;
  allocator<char> local_a51;
  string local_a50;
  byte local_a2a;
  allocator<char> local_a29;
  string local_a28;
  allocator<char> local_a01;
  string local_a00;
  byte local_9da;
  allocator<char> local_9d9;
  string local_9d8;
  allocator<char> local_9b1;
  string local_9b0;
  byte local_98a;
  allocator<char> local_989;
  string local_988;
  allocator<char> local_961;
  string local_960;
  byte local_93a;
  allocator<char> local_939;
  string local_938;
  allocator<char> local_911;
  string local_910;
  byte local_8ea;
  allocator<char> local_8e9;
  string local_8e8;
  allocator<char> local_8c1;
  string local_8c0;
  byte local_89a;
  allocator<char> local_899;
  string local_898;
  allocator<char> local_871;
  string local_870;
  byte local_84a;
  allocator<char> local_849;
  string local_848;
  allocator<char> local_821;
  string local_820;
  byte local_7fa;
  allocator<char> local_7f9;
  string local_7f8;
  allocator<char> local_7d1;
  string local_7d0;
  byte local_7aa;
  allocator<char> local_7a9;
  string local_7a8;
  allocator<char> local_781;
  string local_780;
  byte local_75a;
  allocator<char> local_759;
  string local_758;
  allocator<char> local_731;
  string local_730;
  byte local_70a;
  allocator<char> local_709;
  string local_708;
  allocator<char> local_6e1;
  string local_6e0;
  byte local_6ba;
  allocator<char> local_6b9;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  byte local_66a;
  allocator<char> local_669;
  string local_668;
  allocator<char> local_641;
  string local_640;
  byte local_61a;
  allocator<char> local_619;
  string local_618;
  allocator<char> local_5f1;
  string local_5f0;
  byte local_5ca;
  allocator<char> local_5c9;
  string local_5c8;
  allocator<char> local_5a1;
  string local_5a0;
  byte local_57a;
  allocator<char> local_579;
  string local_578;
  allocator<char> local_551;
  string local_550;
  byte local_52a;
  allocator<char> local_529;
  string local_528;
  allocator<char> local_501;
  string local_500;
  byte local_4da;
  allocator<char> local_4d9;
  string local_4d8;
  allocator<char> local_4b1;
  string local_4b0;
  byte local_48a;
  allocator<char> local_489;
  string local_488;
  allocator<char> local_461;
  string local_460;
  byte local_43a;
  allocator<char> local_439;
  string local_438;
  allocator<char> local_411;
  string local_410;
  byte local_3ea;
  allocator<char> local_3e9;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  byte local_39a;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  byte local_34a;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  string local_320;
  byte local_2fa;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  byte local_2aa;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  byte local_259;
  LSTMWeightParams *local_258;
  LSTMWeightParams *weightParamsB;
  LSTMWeightParams *weightParamsF;
  uint64_t x;
  uint64_t h;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b8 [8];
  string err;
  LSTMParams lstmParams;
  BiDirectionalLSTMLayerParams recurrent;
  ActivationParams *activation_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  RepeatedPtrField<CoreML::Specification::ActivationParams> *__range1_1;
  ActivationParams *activation;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<CoreML::Specification::ActivationParams> *__range1;
  string local_88;
  byte local_62;
  allocator<char> local_61;
  string local_60;
  byte local_3a;
  byte local_39;
  uint local_38;
  byte local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  validateInputCount(__return_storage_ptr__,layer,1,5);
  bVar3 = Result::good(__return_storage_ptr__);
  if (!bVar3) {
    local_21 = 1;
  }
  local_38 = (uint)!bVar3;
  if ((local_21 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 != 0) {
    return __return_storage_ptr__;
  }
  local_39 = 0;
  validateOutputCount(__return_storage_ptr__,local_20,5,5);
  bVar3 = Result::good(__return_storage_ptr__);
  if (!bVar3) {
    local_39 = 1;
  }
  local_38 = (uint)!bVar3;
  if ((local_39 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  pNVar2 = local_20;
  if (local_38 != 0) {
    return __return_storage_ptr__;
  }
  if ((this->ndArrayInterpretation & 1U) != 0) {
    local_3a = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"BiDirectionalLSTM",&local_61);
    validateInputOutputRankEquality(__return_storage_ptr__,pNVar2,&local_60,&this->blobNameToRank);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    bVar3 = Result::good(__return_storage_ptr__);
    if (!bVar3) {
      local_3a = 1;
    }
    local_38 = (uint)!bVar3;
    if ((local_3a & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    pNVar2 = local_20;
    if (local_38 != 0) {
      return __return_storage_ptr__;
    }
    local_62 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"BiDirectionalLSTM",(allocator<char> *)((long)&__range1 + 7));
    validateRankCount(__return_storage_ptr__,pNVar2,&local_88,5,5,&this->blobNameToRank);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    bVar3 = Result::good(__return_storage_ptr__);
    if (!bVar3) {
      local_62 = 1;
    }
    local_38 = (uint)!bVar3;
    if ((local_62 & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    if (local_38 != 0) {
      return __return_storage_ptr__;
    }
  }
  pBVar5 = Specification::NeuralNetworkLayer::bidirectionallstm(local_20);
  pRVar6 = Specification::BiDirectionalLSTMLayerParams::activationsforwardlstm(pBVar5);
  __end1 = google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::begin
                     (pRVar6);
  activation = (ActivationParams *)
               google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::end
                         (pRVar6);
  while (bVar3 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::operator!=
                           (&__end1,(iterator *)&activation), bVar3) {
    pAVar7 = google::protobuf::internal::
             RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::operator*(&__end1);
    validateRecurrentActivationParams(__return_storage_ptr__,pAVar7);
    bVar3 = Result::good(__return_storage_ptr__);
    local_38 = (uint)!bVar3;
    if (bVar3) {
      Result::~Result(__return_storage_ptr__);
    }
    if (local_38 != 0) {
      return __return_storage_ptr__;
    }
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::
    operator++(&__end1);
  }
  pBVar5 = Specification::NeuralNetworkLayer::bidirectionallstm(local_20);
  pRVar6 = Specification::BiDirectionalLSTMLayerParams::activationsbackwardlstm(pBVar5);
  __end1_1 = google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::begin
                       (pRVar6);
  activation_1 = (ActivationParams *)
                 google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::end
                           (pRVar6);
  while (bVar3 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::operator!=
                           (&__end1_1,(iterator *)&activation_1), bVar3) {
    pAVar7 = google::protobuf::internal::
             RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::operator*
                       (&__end1_1);
    validateRecurrentActivationParams(__return_storage_ptr__,pAVar7);
    bVar3 = Result::good(__return_storage_ptr__);
    local_38 = (uint)!bVar3;
    if (bVar3) {
      Result::~Result(__return_storage_ptr__);
    }
    if (local_38 != 0) {
      return __return_storage_ptr__;
    }
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::
    operator++(&__end1_1);
  }
  pUVar8 = Specification::NeuralNetworkLayer::unidirectionallstm(local_20);
  lstmWeightParams = Specification::UniDirectionalLSTMLayerParams::weightparams(pUVar8);
  pUVar8 = Specification::NeuralNetworkLayer::unidirectionallstm(local_20);
  pLVar9 = Specification::UniDirectionalLSTMLayerParams::params(pUVar8);
  Specification::LSTMParams::LSTMParams((LSTMParams *)&recurrent._cached_size_,pLVar9);
  validateLSTMWeightParams
            (__return_storage_ptr__,lstmWeightParams,(LSTMParams *)&recurrent._cached_size_);
  Specification::LSTMParams::~LSTMParams((LSTMParams *)&recurrent._cached_size_);
  bVar3 = Result::good(__return_storage_ptr__);
  local_38 = (uint)!bVar3;
  if (bVar3) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 != 0) {
    return __return_storage_ptr__;
  }
  pBVar5 = Specification::NeuralNetworkLayer::bidirectionallstm(local_20);
  Specification::BiDirectionalLSTMLayerParams::BiDirectionalLSTMLayerParams
            ((BiDirectionalLSTMLayerParams *)&lstmParams.coupledinputandforgetgate_,pBVar5);
  pLVar9 = Specification::BiDirectionalLSTMLayerParams::params
                     ((BiDirectionalLSTMLayerParams *)&lstmParams.coupledinputandforgetgate_);
  Specification::LSTMParams::LSTMParams((LSTMParams *)((long)&err.field_2 + 8),pLVar9);
  std::__cxx11::string::string((string *)local_1b8);
  iVar4 = Specification::BiDirectionalLSTMLayerParams::activationsforwardlstm_size
                    ((BiDirectionalLSTMLayerParams *)&lstmParams.coupledinputandforgetgate_);
  if (iVar4 == 3) {
    iVar4 = Specification::BiDirectionalLSTMLayerParams::activationsbackwardlstm_size
                      ((BiDirectionalLSTMLayerParams *)&lstmParams.coupledinputandforgetgate_);
    if (iVar4 == 3) {
      x = Specification::BiDirectionalLSTMLayerParams::outputvectorsize
                    ((BiDirectionalLSTMLayerParams *)&lstmParams.coupledinputandforgetgate_);
      weightParamsF =
           (LSTMWeightParams *)
           Specification::BiDirectionalLSTMLayerParams::inputvectorsize
                     ((BiDirectionalLSTMLayerParams *)&lstmParams.coupledinputandforgetgate_);
      weightParamsB =
           Specification::BiDirectionalLSTMLayerParams::weightparams
                     ((BiDirectionalLSTMLayerParams *)&lstmParams.coupledinputandforgetgate_,0);
      local_258 = Specification::BiDirectionalLSTMLayerParams::weightparams
                            ((BiDirectionalLSTMLayerParams *)&lstmParams.coupledinputandforgetgate_,
                             1);
      local_259 = 0;
      pWVar11 = Specification::LSTMWeightParams::inputgateweightmatrix(weightParamsB);
      uVar1 = x;
      uVar12 = x * (long)weightParamsF;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_280,"Bidirectional LSTM",&local_281);
      psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a8,"forward input gate weight matrix",&local_2a9);
      validateGeneralWeightParams
                (__return_storage_ptr__,pWVar11,uVar12,uVar1,&local_280,psVar10,&local_2a8);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::allocator<char>::~allocator(&local_2a9);
      std::__cxx11::string::~string((string *)&local_280);
      std::allocator<char>::~allocator(&local_281);
      bVar3 = Result::good(__return_storage_ptr__);
      if (!bVar3) {
        local_259 = 1;
      }
      local_38 = (uint)!bVar3;
      if ((local_259 & 1) == 0) {
        Result::~Result(__return_storage_ptr__);
      }
      if (local_38 == 0) {
        local_2aa = 0;
        pWVar11 = Specification::LSTMWeightParams::forgetgateweightmatrix(weightParamsB);
        uVar1 = x;
        uVar12 = x * (long)weightParamsF;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2d0,"Bidirectional LSTM",&local_2d1);
        psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f8,"forward forget gate weight matrix",&local_2f9);
        validateGeneralWeightParams
                  (__return_storage_ptr__,pWVar11,uVar12,uVar1,&local_2d0,psVar10,&local_2f8);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::allocator<char>::~allocator(&local_2f9);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::allocator<char>::~allocator(&local_2d1);
        bVar3 = Result::good(__return_storage_ptr__);
        if (!bVar3) {
          local_2aa = 1;
        }
        local_38 = (uint)!bVar3;
        if ((local_2aa & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        if (local_38 == 0) {
          local_2fa = 0;
          pWVar11 = Specification::LSTMWeightParams::blockinputweightmatrix(weightParamsB);
          uVar1 = x;
          uVar12 = x * (long)weightParamsF;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_320,"Bidirectional LSTM",&local_321);
          psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_348,"forward block input gate weight matrix",&local_349);
          validateGeneralWeightParams
                    (__return_storage_ptr__,pWVar11,uVar12,uVar1,&local_320,psVar10,&local_348);
          std::__cxx11::string::~string((string *)&local_348);
          std::allocator<char>::~allocator(&local_349);
          std::__cxx11::string::~string((string *)&local_320);
          std::allocator<char>::~allocator(&local_321);
          bVar3 = Result::good(__return_storage_ptr__);
          if (!bVar3) {
            local_2fa = 1;
          }
          local_38 = (uint)!bVar3;
          if ((local_2fa & 1) == 0) {
            Result::~Result(__return_storage_ptr__);
          }
          if (local_38 == 0) {
            local_34a = 0;
            pWVar11 = Specification::LSTMWeightParams::outputgateweightmatrix(weightParamsB);
            uVar1 = x;
            uVar12 = x * (long)weightParamsF;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_370,"Bidirectional LSTM",&local_371);
            psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_398,"forward output gate weight matrix",&local_399);
            validateGeneralWeightParams
                      (__return_storage_ptr__,pWVar11,uVar12,uVar1,&local_370,psVar10,&local_398);
            std::__cxx11::string::~string((string *)&local_398);
            std::allocator<char>::~allocator(&local_399);
            std::__cxx11::string::~string((string *)&local_370);
            std::allocator<char>::~allocator(&local_371);
            bVar3 = Result::good(__return_storage_ptr__);
            if (!bVar3) {
              local_34a = 1;
            }
            local_38 = (uint)!bVar3;
            if ((local_34a & 1) == 0) {
              Result::~Result(__return_storage_ptr__);
            }
            if (local_38 == 0) {
              local_39a = 0;
              pWVar11 = Specification::LSTMWeightParams::inputgaterecursionmatrix(weightParamsB);
              uVar1 = x;
              uVar12 = x * x;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_3c0,"Bidirectional LSTM",&local_3c1);
              psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_3e8,"forward input gate recursion matrix",&local_3e9);
              validateGeneralWeightParams
                        (__return_storage_ptr__,pWVar11,uVar12,uVar1,&local_3c0,psVar10,&local_3e8);
              std::__cxx11::string::~string((string *)&local_3e8);
              std::allocator<char>::~allocator(&local_3e9);
              std::__cxx11::string::~string((string *)&local_3c0);
              std::allocator<char>::~allocator(&local_3c1);
              bVar3 = Result::good(__return_storage_ptr__);
              if (!bVar3) {
                local_39a = 1;
              }
              local_38 = (uint)!bVar3;
              if ((local_39a & 1) == 0) {
                Result::~Result(__return_storage_ptr__);
              }
              if (local_38 == 0) {
                local_3ea = 0;
                pWVar11 = Specification::LSTMWeightParams::forgetgaterecursionmatrix(weightParamsB);
                uVar1 = x;
                uVar12 = x * x;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_410,"Bidirectional LSTM",&local_411);
                psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_438,"forward forget gate recursion matrix",&local_439);
                validateGeneralWeightParams
                          (__return_storage_ptr__,pWVar11,uVar12,uVar1,&local_410,psVar10,&local_438
                          );
                std::__cxx11::string::~string((string *)&local_438);
                std::allocator<char>::~allocator(&local_439);
                std::__cxx11::string::~string((string *)&local_410);
                std::allocator<char>::~allocator(&local_411);
                bVar3 = Result::good(__return_storage_ptr__);
                if (!bVar3) {
                  local_3ea = 1;
                }
                local_38 = (uint)!bVar3;
                if ((local_3ea & 1) == 0) {
                  Result::~Result(__return_storage_ptr__);
                }
                if (local_38 == 0) {
                  local_43a = 0;
                  pWVar11 = Specification::LSTMWeightParams::blockinputrecursionmatrix
                                      (weightParamsB);
                  uVar1 = x;
                  uVar12 = x * x;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_460,"Bidirectional LSTM",&local_461);
                  psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_488,"forward block input gate recursion matrix",
                             &local_489);
                  validateGeneralWeightParams
                            (__return_storage_ptr__,pWVar11,uVar12,uVar1,&local_460,psVar10,
                             &local_488);
                  std::__cxx11::string::~string((string *)&local_488);
                  std::allocator<char>::~allocator(&local_489);
                  std::__cxx11::string::~string((string *)&local_460);
                  std::allocator<char>::~allocator(&local_461);
                  bVar3 = Result::good(__return_storage_ptr__);
                  if (!bVar3) {
                    local_43a = 1;
                  }
                  local_38 = (uint)!bVar3;
                  if ((local_43a & 1) == 0) {
                    Result::~Result(__return_storage_ptr__);
                  }
                  if (local_38 == 0) {
                    local_48a = 0;
                    pWVar11 = Specification::LSTMWeightParams::outputgaterecursionmatrix
                                        (weightParamsB);
                    uVar1 = x;
                    uVar12 = x * x;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_4b0,"Bidirectional LSTM",&local_4b1);
                    psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_4d8,"forward output gate recursion matrix",
                               &local_4d9);
                    validateGeneralWeightParams
                              (__return_storage_ptr__,pWVar11,uVar12,uVar1,&local_4b0,psVar10,
                               &local_4d8);
                    std::__cxx11::string::~string((string *)&local_4d8);
                    std::allocator<char>::~allocator(&local_4d9);
                    std::__cxx11::string::~string((string *)&local_4b0);
                    std::allocator<char>::~allocator(&local_4b1);
                    bVar3 = Result::good(__return_storage_ptr__);
                    if (!bVar3) {
                      local_48a = 1;
                    }
                    local_38 = (uint)!bVar3;
                    if ((local_48a & 1) == 0) {
                      Result::~Result(__return_storage_ptr__);
                    }
                    if (local_38 == 0) {
                      local_4da = 0;
                      pWVar11 = Specification::LSTMWeightParams::inputgateweightmatrix(local_258);
                      uVar1 = x;
                      uVar12 = x * (long)weightParamsF;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_500,"Bidirectional LSTM",&local_501);
                      psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_528,"backward input gate weight matrix",&local_529
                                );
                      validateGeneralWeightParams
                                (__return_storage_ptr__,pWVar11,uVar12,uVar1,&local_500,psVar10,
                                 &local_528);
                      std::__cxx11::string::~string((string *)&local_528);
                      std::allocator<char>::~allocator(&local_529);
                      std::__cxx11::string::~string((string *)&local_500);
                      std::allocator<char>::~allocator(&local_501);
                      bVar3 = Result::good(__return_storage_ptr__);
                      if (!bVar3) {
                        local_4da = 1;
                      }
                      local_38 = (uint)!bVar3;
                      if ((local_4da & 1) == 0) {
                        Result::~Result(__return_storage_ptr__);
                      }
                      if (local_38 == 0) {
                        local_52a = 0;
                        pWVar11 = Specification::LSTMWeightParams::forgetgateweightmatrix(local_258)
                        ;
                        uVar1 = x;
                        uVar12 = x * (long)weightParamsF;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_550,"Bidirectional LSTM",&local_551);
                        psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_578,"backward forget gate weight matrix",
                                   &local_579);
                        validateGeneralWeightParams
                                  (__return_storage_ptr__,pWVar11,uVar12,uVar1,&local_550,psVar10,
                                   &local_578);
                        std::__cxx11::string::~string((string *)&local_578);
                        std::allocator<char>::~allocator(&local_579);
                        std::__cxx11::string::~string((string *)&local_550);
                        std::allocator<char>::~allocator(&local_551);
                        bVar3 = Result::good(__return_storage_ptr__);
                        if (!bVar3) {
                          local_52a = 1;
                        }
                        local_38 = (uint)!bVar3;
                        if ((local_52a & 1) == 0) {
                          Result::~Result(__return_storage_ptr__);
                        }
                        if (local_38 == 0) {
                          local_57a = 0;
                          pWVar11 = Specification::LSTMWeightParams::blockinputweightmatrix
                                              (local_258);
                          uVar1 = x;
                          uVar12 = x * (long)weightParamsF;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_5a0,"Bidirectional LSTM",&local_5a1);
                          psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_5c8,"backward block input gate weight matrix",
                                     &local_5c9);
                          validateGeneralWeightParams
                                    (__return_storage_ptr__,pWVar11,uVar12,uVar1,&local_5a0,psVar10,
                                     &local_5c8);
                          std::__cxx11::string::~string((string *)&local_5c8);
                          std::allocator<char>::~allocator(&local_5c9);
                          std::__cxx11::string::~string((string *)&local_5a0);
                          std::allocator<char>::~allocator(&local_5a1);
                          bVar3 = Result::good(__return_storage_ptr__);
                          if (!bVar3) {
                            local_57a = 1;
                          }
                          local_38 = (uint)!bVar3;
                          if ((local_57a & 1) == 0) {
                            Result::~Result(__return_storage_ptr__);
                          }
                          if (local_38 == 0) {
                            local_5ca = 0;
                            pWVar11 = Specification::LSTMWeightParams::outputgateweightmatrix
                                                (local_258);
                            uVar1 = x;
                            uVar12 = x * (long)weightParamsF;
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_5f0,"Bidirectional LSTM",&local_5f1);
                            psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_618,"backward output gate weight matrix",
                                       &local_619);
                            validateGeneralWeightParams
                                      (__return_storage_ptr__,pWVar11,uVar12,uVar1,&local_5f0,
                                       psVar10,&local_618);
                            std::__cxx11::string::~string((string *)&local_618);
                            std::allocator<char>::~allocator(&local_619);
                            std::__cxx11::string::~string((string *)&local_5f0);
                            std::allocator<char>::~allocator(&local_5f1);
                            bVar3 = Result::good(__return_storage_ptr__);
                            if (!bVar3) {
                              local_5ca = 1;
                            }
                            local_38 = (uint)!bVar3;
                            if ((local_5ca & 1) == 0) {
                              Result::~Result(__return_storage_ptr__);
                            }
                            if (local_38 == 0) {
                              local_61a = 0;
                              pWVar11 = Specification::LSTMWeightParams::inputgaterecursionmatrix
                                                  (local_258);
                              uVar1 = x;
                              uVar12 = x * x;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_640,"Bidirectional LSTM",&local_641);
                              psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20)
                              ;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_668,"backward input gate recursion matrix"
                                         ,&local_669);
                              validateGeneralWeightParams
                                        (__return_storage_ptr__,pWVar11,uVar12,uVar1,&local_640,
                                         psVar10,&local_668);
                              std::__cxx11::string::~string((string *)&local_668);
                              std::allocator<char>::~allocator(&local_669);
                              std::__cxx11::string::~string((string *)&local_640);
                              std::allocator<char>::~allocator(&local_641);
                              bVar3 = Result::good(__return_storage_ptr__);
                              if (!bVar3) {
                                local_61a = 1;
                              }
                              local_38 = (uint)!bVar3;
                              if ((local_61a & 1) == 0) {
                                Result::~Result(__return_storage_ptr__);
                              }
                              if (local_38 == 0) {
                                local_66a = 0;
                                pWVar11 = Specification::LSTMWeightParams::forgetgaterecursionmatrix
                                                    (local_258);
                                uVar1 = x;
                                uVar12 = x * x;
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_690,"Bidirectional LSTM",&local_691);
                                psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                    (local_20);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_6b8,
                                           "backward forget gate recursion matrix",&local_6b9);
                                validateGeneralWeightParams
                                          (__return_storage_ptr__,pWVar11,uVar12,uVar1,&local_690,
                                           psVar10,&local_6b8);
                                std::__cxx11::string::~string((string *)&local_6b8);
                                std::allocator<char>::~allocator(&local_6b9);
                                std::__cxx11::string::~string((string *)&local_690);
                                std::allocator<char>::~allocator(&local_691);
                                bVar3 = Result::good(__return_storage_ptr__);
                                if (!bVar3) {
                                  local_66a = 1;
                                }
                                local_38 = (uint)!bVar3;
                                if ((local_66a & 1) == 0) {
                                  Result::~Result(__return_storage_ptr__);
                                }
                                if (local_38 == 0) {
                                  local_6ba = 0;
                                  pWVar11 = Specification::LSTMWeightParams::
                                            blockinputrecursionmatrix(local_258);
                                  uVar1 = x;
                                  uVar12 = x * x;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_6e0,"Bidirectional LSTM",&local_6e1);
                                  psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                      (local_20);
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_708,
                                             "backward block input gate recursion matrix",&local_709
                                            );
                                  validateGeneralWeightParams
                                            (__return_storage_ptr__,pWVar11,uVar12,uVar1,&local_6e0,
                                             psVar10,&local_708);
                                  std::__cxx11::string::~string((string *)&local_708);
                                  std::allocator<char>::~allocator(&local_709);
                                  std::__cxx11::string::~string((string *)&local_6e0);
                                  std::allocator<char>::~allocator(&local_6e1);
                                  bVar3 = Result::good(__return_storage_ptr__);
                                  if (!bVar3) {
                                    local_6ba = 1;
                                  }
                                  local_38 = (uint)!bVar3;
                                  if ((local_6ba & 1) == 0) {
                                    Result::~Result(__return_storage_ptr__);
                                  }
                                  if (local_38 == 0) {
                                    local_70a = 0;
                                    pWVar11 = Specification::LSTMWeightParams::
                                              outputgaterecursionmatrix(local_258);
                                    uVar1 = x;
                                    uVar12 = x * x;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_730,"Bidirectional LSTM",&local_731)
                                    ;
                                    psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                        (local_20);
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_758,
                                               "backward output gate recursion matrix",&local_759);
                                    validateGeneralWeightParams
                                              (__return_storage_ptr__,pWVar11,uVar12,uVar1,
                                               &local_730,psVar10,&local_758);
                                    std::__cxx11::string::~string((string *)&local_758);
                                    std::allocator<char>::~allocator(&local_759);
                                    std::__cxx11::string::~string((string *)&local_730);
                                    std::allocator<char>::~allocator(&local_731);
                                    bVar3 = Result::good(__return_storage_ptr__);
                                    if (!bVar3) {
                                      local_70a = 1;
                                    }
                                    local_38 = (uint)!bVar3;
                                    if ((local_70a & 1) == 0) {
                                      Result::~Result(__return_storage_ptr__);
                                    }
                                    if (local_38 == 0) {
                                      pLVar9 = Specification::BiDirectionalLSTMLayerParams::params
                                                         ((BiDirectionalLSTMLayerParams *)
                                                          &lstmParams.coupledinputandforgetgate_);
                                      bVar3 = Specification::LSTMParams::hasbiasvectors(pLVar9);
                                      if (bVar3) {
                                        local_75a = 0;
                                        pWVar11 = Specification::LSTMWeightParams::
                                                  inputgatebiasvector(weightParamsB);
                                        uVar1 = x;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_780,"Bidirectional LSTM",
                                                   &local_781);
                                        psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                            (local_20);
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_7a8,
                                                   "forward input gate bias vector",&local_7a9);
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,pWVar11,uVar1,1,&local_780
                                                   ,psVar10,&local_7a8);
                                        std::__cxx11::string::~string((string *)&local_7a8);
                                        std::allocator<char>::~allocator(&local_7a9);
                                        std::__cxx11::string::~string((string *)&local_780);
                                        std::allocator<char>::~allocator(&local_781);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) {
                                          local_75a = 1;
                                        }
                                        local_38 = (uint)!bVar3;
                                        if ((local_75a & 1) == 0) {
                                          Result::~Result(__return_storage_ptr__);
                                        }
                                        if (local_38 != 0) goto LAB_004d0ce6;
                                        local_7aa = 0;
                                        pWVar11 = Specification::LSTMWeightParams::
                                                  forgetgatebiasvector(weightParamsB);
                                        uVar1 = x;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_7d0,"Bidirectional LSTM",
                                                   &local_7d1);
                                        psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                            (local_20);
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_7f8,
                                                   "forward forget gate bias vector",&local_7f9);
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,pWVar11,uVar1,1,&local_7d0
                                                   ,psVar10,&local_7f8);
                                        std::__cxx11::string::~string((string *)&local_7f8);
                                        std::allocator<char>::~allocator(&local_7f9);
                                        std::__cxx11::string::~string((string *)&local_7d0);
                                        std::allocator<char>::~allocator(&local_7d1);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) {
                                          local_7aa = 1;
                                        }
                                        local_38 = (uint)!bVar3;
                                        if ((local_7aa & 1) == 0) {
                                          Result::~Result(__return_storage_ptr__);
                                        }
                                        if (local_38 != 0) goto LAB_004d0ce6;
                                        local_7fa = 0;
                                        pWVar11 = Specification::LSTMWeightParams::
                                                  blockinputbiasvector(weightParamsB);
                                        uVar1 = x;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_820,"Bidirectional LSTM",
                                                   &local_821);
                                        psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                            (local_20);
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_848,
                                                   "forward block input bias vector",&local_849);
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,pWVar11,uVar1,1,&local_820
                                                   ,psVar10,&local_848);
                                        std::__cxx11::string::~string((string *)&local_848);
                                        std::allocator<char>::~allocator(&local_849);
                                        std::__cxx11::string::~string((string *)&local_820);
                                        std::allocator<char>::~allocator(&local_821);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) {
                                          local_7fa = 1;
                                        }
                                        local_38 = (uint)!bVar3;
                                        if ((local_7fa & 1) == 0) {
                                          Result::~Result(__return_storage_ptr__);
                                        }
                                        if (local_38 != 0) goto LAB_004d0ce6;
                                        local_84a = 0;
                                        pWVar11 = Specification::LSTMWeightParams::
                                                  outputgatebiasvector(weightParamsB);
                                        uVar1 = x;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_870,"Bidirectional LSTM",
                                                   &local_871);
                                        psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                            (local_20);
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_898,
                                                   "forward output gate bias vector",&local_899);
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,pWVar11,uVar1,1,&local_870
                                                   ,psVar10,&local_898);
                                        std::__cxx11::string::~string((string *)&local_898);
                                        std::allocator<char>::~allocator(&local_899);
                                        std::__cxx11::string::~string((string *)&local_870);
                                        std::allocator<char>::~allocator(&local_871);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) {
                                          local_84a = 1;
                                        }
                                        local_38 = (uint)!bVar3;
                                        if ((local_84a & 1) == 0) {
                                          Result::~Result(__return_storage_ptr__);
                                        }
                                        if (local_38 != 0) goto LAB_004d0ce6;
                                        local_89a = 0;
                                        pWVar11 = Specification::LSTMWeightParams::
                                                  inputgatebiasvector(local_258);
                                        uVar1 = x;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_8c0,"Bidirectional LSTM",
                                                   &local_8c1);
                                        psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                            (local_20);
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_8e8,
                                                   "backward input gate bias vector",&local_8e9);
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,pWVar11,uVar1,1,&local_8c0
                                                   ,psVar10,&local_8e8);
                                        std::__cxx11::string::~string((string *)&local_8e8);
                                        std::allocator<char>::~allocator(&local_8e9);
                                        std::__cxx11::string::~string((string *)&local_8c0);
                                        std::allocator<char>::~allocator(&local_8c1);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) {
                                          local_89a = 1;
                                        }
                                        local_38 = (uint)!bVar3;
                                        if ((local_89a & 1) == 0) {
                                          Result::~Result(__return_storage_ptr__);
                                        }
                                        if (local_38 != 0) goto LAB_004d0ce6;
                                        local_8ea = 0;
                                        pWVar11 = Specification::LSTMWeightParams::
                                                  forgetgatebiasvector(local_258);
                                        uVar1 = x;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_910,"Bidirectional LSTM",
                                                   &local_911);
                                        psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                            (local_20);
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_938,
                                                   "backward forget gate bias vector",&local_939);
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,pWVar11,uVar1,1,&local_910
                                                   ,psVar10,&local_938);
                                        std::__cxx11::string::~string((string *)&local_938);
                                        std::allocator<char>::~allocator(&local_939);
                                        std::__cxx11::string::~string((string *)&local_910);
                                        std::allocator<char>::~allocator(&local_911);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) {
                                          local_8ea = 1;
                                        }
                                        local_38 = (uint)!bVar3;
                                        if ((local_8ea & 1) == 0) {
                                          Result::~Result(__return_storage_ptr__);
                                        }
                                        if (local_38 != 0) goto LAB_004d0ce6;
                                        local_93a = 0;
                                        pWVar11 = Specification::LSTMWeightParams::
                                                  blockinputbiasvector(local_258);
                                        uVar1 = x;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_960,"Bidirectional LSTM",
                                                   &local_961);
                                        psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                            (local_20);
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_988,
                                                   "backward block input bias vector",&local_989);
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,pWVar11,uVar1,1,&local_960
                                                   ,psVar10,&local_988);
                                        std::__cxx11::string::~string((string *)&local_988);
                                        std::allocator<char>::~allocator(&local_989);
                                        std::__cxx11::string::~string((string *)&local_960);
                                        std::allocator<char>::~allocator(&local_961);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) {
                                          local_93a = 1;
                                        }
                                        local_38 = (uint)!bVar3;
                                        if ((local_93a & 1) == 0) {
                                          Result::~Result(__return_storage_ptr__);
                                        }
                                        if (local_38 != 0) goto LAB_004d0ce6;
                                        local_98a = 0;
                                        pWVar11 = Specification::LSTMWeightParams::
                                                  outputgatebiasvector(local_258);
                                        uVar1 = x;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_9b0,"Bidirectional LSTM",
                                                   &local_9b1);
                                        psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                            (local_20);
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_9d8,
                                                   "backward output gate bias vector",&local_9d9);
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,pWVar11,uVar1,1,&local_9b0
                                                   ,psVar10,&local_9d8);
                                        std::__cxx11::string::~string((string *)&local_9d8);
                                        std::allocator<char>::~allocator(&local_9d9);
                                        std::__cxx11::string::~string((string *)&local_9b0);
                                        std::allocator<char>::~allocator(&local_9b1);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) {
                                          local_98a = 1;
                                        }
                                        local_38 = (uint)!bVar3;
                                        if ((local_98a & 1) == 0) {
                                          Result::~Result(__return_storage_ptr__);
                                        }
                                        if (local_38 != 0) goto LAB_004d0ce6;
                                      }
                                      pLVar9 = Specification::BiDirectionalLSTMLayerParams::params
                                                         ((BiDirectionalLSTMLayerParams *)
                                                          &lstmParams.coupledinputandforgetgate_);
                                      bVar3 = Specification::LSTMParams::haspeepholevectors(pLVar9);
                                      if (bVar3) {
                                        local_9da = 0;
                                        pWVar11 = Specification::LSTMWeightParams::
                                                  inputgatepeepholevector(weightParamsB);
                                        uVar1 = x;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_a00,"Bidirectional LSTM",
                                                   &local_a01);
                                        psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                            (local_20);
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_a28,
                                                   "forward input gate peephole vector",&local_a29);
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,pWVar11,uVar1,1,&local_a00
                                                   ,psVar10,&local_a28);
                                        std::__cxx11::string::~string((string *)&local_a28);
                                        std::allocator<char>::~allocator(&local_a29);
                                        std::__cxx11::string::~string((string *)&local_a00);
                                        std::allocator<char>::~allocator(&local_a01);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) {
                                          local_9da = 1;
                                        }
                                        local_38 = (uint)!bVar3;
                                        if ((local_9da & 1) == 0) {
                                          Result::~Result(__return_storage_ptr__);
                                        }
                                        if (local_38 != 0) goto LAB_004d0ce6;
                                        local_a2a = 0;
                                        pWVar11 = Specification::LSTMWeightParams::
                                                  forgetgatepeepholevector(weightParamsB);
                                        uVar1 = x;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_a50,"Bidirectional LSTM",
                                                   &local_a51);
                                        psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                            (local_20);
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_a78,
                                                   "forward forget gate peephole vector",&local_a79)
                                        ;
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,pWVar11,uVar1,1,&local_a50
                                                   ,psVar10,&local_a78);
                                        std::__cxx11::string::~string((string *)&local_a78);
                                        std::allocator<char>::~allocator(&local_a79);
                                        std::__cxx11::string::~string((string *)&local_a50);
                                        std::allocator<char>::~allocator(&local_a51);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) {
                                          local_a2a = 1;
                                        }
                                        local_38 = (uint)!bVar3;
                                        if ((local_a2a & 1) == 0) {
                                          Result::~Result(__return_storage_ptr__);
                                        }
                                        if (local_38 != 0) goto LAB_004d0ce6;
                                        local_a7a = 0;
                                        pWVar11 = Specification::LSTMWeightParams::
                                                  outputgatepeepholevector(weightParamsB);
                                        uVar1 = x;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_aa0,"Bidirectional LSTM",
                                                   &local_aa1);
                                        psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                            (local_20);
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_ac8,
                                                   "forward output gate peephole vector",&local_ac9)
                                        ;
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,pWVar11,uVar1,1,&local_aa0
                                                   ,psVar10,&local_ac8);
                                        std::__cxx11::string::~string((string *)&local_ac8);
                                        std::allocator<char>::~allocator(&local_ac9);
                                        std::__cxx11::string::~string((string *)&local_aa0);
                                        std::allocator<char>::~allocator(&local_aa1);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) {
                                          local_a7a = 1;
                                        }
                                        local_38 = (uint)!bVar3;
                                        if ((local_a7a & 1) == 0) {
                                          Result::~Result(__return_storage_ptr__);
                                        }
                                        if (local_38 != 0) goto LAB_004d0ce6;
                                        local_aca = 0;
                                        pWVar11 = Specification::LSTMWeightParams::
                                                  inputgatepeepholevector(local_258);
                                        uVar1 = x;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_af0,"Bidirectional LSTM",
                                                   &local_af1);
                                        psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                            (local_20);
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_b18,
                                                   "backward input gate peephole vector",&local_b19)
                                        ;
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,pWVar11,uVar1,1,&local_af0
                                                   ,psVar10,&local_b18);
                                        std::__cxx11::string::~string((string *)&local_b18);
                                        std::allocator<char>::~allocator(&local_b19);
                                        std::__cxx11::string::~string((string *)&local_af0);
                                        std::allocator<char>::~allocator(&local_af1);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) {
                                          local_aca = 1;
                                        }
                                        local_38 = (uint)!bVar3;
                                        if ((local_aca & 1) == 0) {
                                          Result::~Result(__return_storage_ptr__);
                                        }
                                        if (local_38 != 0) goto LAB_004d0ce6;
                                        local_b1a = 0;
                                        pWVar11 = Specification::LSTMWeightParams::
                                                  forgetgatepeepholevector(local_258);
                                        uVar1 = x;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_b40,"Bidirectional LSTM",
                                                   &local_b41);
                                        psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                            (local_20);
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_b68,
                                                   "backward forget gate peephole vector",&local_b69
                                                  );
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,pWVar11,uVar1,1,&local_b40
                                                   ,psVar10,&local_b68);
                                        std::__cxx11::string::~string((string *)&local_b68);
                                        std::allocator<char>::~allocator(&local_b69);
                                        std::__cxx11::string::~string((string *)&local_b40);
                                        std::allocator<char>::~allocator(&local_b41);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) {
                                          local_b1a = 1;
                                        }
                                        local_38 = (uint)!bVar3;
                                        if ((local_b1a & 1) == 0) {
                                          Result::~Result(__return_storage_ptr__);
                                        }
                                        if (local_38 != 0) goto LAB_004d0ce6;
                                        local_b6a = 0;
                                        pWVar11 = Specification::LSTMWeightParams::
                                                  outputgatepeepholevector(local_258);
                                        uVar1 = x;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_b90,"Bidirectional LSTM",
                                                   &local_b91);
                                        psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                            (local_20);
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_bb8,
                                                   "backward output gate peephole vector",&local_bb9
                                                  );
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,pWVar11,uVar1,1,&local_b90
                                                   ,psVar10,&local_bb8);
                                        std::__cxx11::string::~string((string *)&local_bb8);
                                        std::allocator<char>::~allocator(&local_bb9);
                                        std::__cxx11::string::~string((string *)&local_b90);
                                        std::allocator<char>::~allocator(&local_b91);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) {
                                          local_b6a = 1;
                                        }
                                        local_38 = (uint)!bVar3;
                                        if ((local_b6a & 1) == 0) {
                                          Result::~Result(__return_storage_ptr__);
                                        }
                                        if (local_38 != 0) goto LAB_004d0ce6;
                                      }
                                      Result::Result(__return_storage_ptr__);
                                      local_38 = 1;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&h,
                     "Bidirectional LSTM layer:",psVar10);
      std::operator+(&local_218,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&h,
                     " backward lstm must provide 3 activations");
      std::__cxx11::string::operator=((string *)local_1b8,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&h);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b8);
      local_38 = 1;
    }
  }
  else {
    psVar10 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
    std::operator+(&local_1f8,"Bidirectional LSTM layer:",psVar10);
    std::operator+(&local_1d8,&local_1f8," forward lstm must provide 3 activations");
    std::__cxx11::string::operator=((string *)local_1b8,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b8);
    local_38 = 1;
  }
LAB_004d0ce6:
  std::__cxx11::string::~string((string *)local_1b8);
  Specification::LSTMParams::~LSTMParams((LSTMParams *)((long)&err.field_2 + 8));
  Specification::BiDirectionalLSTMLayerParams::~BiDirectionalLSTMLayerParams
            ((BiDirectionalLSTMLayerParams *)&lstmParams.coupledinputandforgetgate_);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBiDirectionalLSTMLayer(const Specification::NeuralNetworkLayer& layer) {
    // Must specify hidden states
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 5));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 5, 5));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "BiDirectionalLSTM", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "BiDirectionalLSTM", 5, 5, blobNameToRank));
    }

    for (const auto& activation : layer.bidirectionallstm().activationsforwardlstm()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRecurrentActivationParams(activation));
    }
    for (const auto& activation : layer.bidirectionallstm().activationsbackwardlstm()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRecurrentActivationParams(activation));
    }

    // Validate common LSTM params and ensure that all weight field types are consistent
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateLSTMWeightParams(layer.unidirectionallstm().weightparams(), layer.unidirectionallstm().params()));

    Specification::BiDirectionalLSTMLayerParams recurrent = layer.bidirectionallstm();
    Specification::LSTMParams lstmParams = recurrent.params();
    std::string err;

    if (recurrent.activationsforwardlstm_size() != 3) {
        err = std::string("Bidirectional LSTM layer:" + layer.name() + " forward lstm must provide 3 activations");
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (recurrent.activationsbackwardlstm_size() != 3){
        err = std::string("Bidirectional LSTM layer:" + layer.name() + " backward lstm must provide 3 activations");
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Verify weights and biases sizes
    uint64_t h = recurrent.outputvectorsize();
    uint64_t x = recurrent.inputvectorsize();
    const Specification::LSTMWeightParams& weightParamsF = recurrent.weightparams(0);
    const Specification::LSTMWeightParams& weightParamsB = recurrent.weightparams(1);

    // Check forward weight matrices' sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.inputgateweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward input gate weight matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.forgetgateweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward forget gate weight matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.blockinputweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward block input gate weight matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.outputgateweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward output gate weight matrix"));

    // Check forward recursion matrices' sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.inputgaterecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward input gate recursion matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.forgetgaterecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward forget gate recursion matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.blockinputrecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward block input gate recursion matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.outputgaterecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward output gate recursion matrix"));
    // Check backward weight matrices' sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.inputgateweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward input gate weight matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.forgetgateweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward forget gate weight matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.blockinputweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward block input gate weight matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.outputgateweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward output gate weight matrix"));

    // Check backward recursion matrices' sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.inputgaterecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward input gate recursion matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.forgetgaterecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward forget gate recursion matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.blockinputrecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward block input gate recursion matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.outputgaterecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward output gate recursion matrix"));

    // Check bias vectors
    if (recurrent.params().hasbiasvectors()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.inputgatebiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward input gate bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.forgetgatebiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward forget gate bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.blockinputbiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward block input bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.outputgatebiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward output gate bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.inputgatebiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward input gate bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.forgetgatebiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward forget gate bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.blockinputbiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward block input bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.outputgatebiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward output gate bias vector"));
    }
    // Check peephole vectors
    if (recurrent.params().haspeepholevectors()){
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.inputgatepeepholevector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward input gate peephole vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.forgetgatepeepholevector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward forget gate peephole vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.outputgatepeepholevector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward output gate peephole vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.inputgatepeepholevector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward input gate peephole vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.forgetgatepeepholevector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward forget gate peephole vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.outputgatepeepholevector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward output gate peephole vector"));
    }
    return Result();
}